

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O1

char * xmemmem(char *hay,size_t hz_,char *ndl,size_t nz)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  char *pcVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *__s1;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  
  pbVar3 = (byte *)memchr(hay,(int)*ndl,hz_);
  if (pbVar3 != (byte *)0x0) {
    pbVar6 = (byte *)(hay + hz_);
    bVar4 = *pbVar3;
    __s1 = pbVar3 + 1;
    bVar9 = 1 < (long)nz;
    bVar1 = false;
    pbVar7 = __s1;
    bVar8 = bVar4;
    if (1 < (long)nz && __s1 < pbVar6) {
      bVar1 = true;
      pcVar5 = ndl + 2;
      do {
        bVar4 = bVar4 ^ *pbVar7;
        bVar8 = bVar8 ^ pcVar5[-1];
        if (*pbVar7 != pcVar5[-1]) {
          bVar1 = false;
        }
        pbVar7 = pbVar7 + 1;
        bVar9 = pcVar5 < ndl + nz;
      } while ((pbVar7 < pbVar6) && (bVar10 = pcVar5 < ndl + nz, pcVar5 = pcVar5 + 1, bVar10));
      bVar1 = !bVar1;
    }
    if (!bVar9) {
      if (!bVar1) {
        return (char *)pbVar3;
      }
      if (pbVar7 < pbVar6) {
        do {
          pbVar3 = pbVar3 + 1;
          bVar4 = *pbVar7 ^ __s1[-1] ^ bVar4;
          if ((bVar4 == bVar8) && (iVar2 = bcmp(__s1,ndl,nz - 1), iVar2 == 0)) {
            return (char *)pbVar3;
          }
          pbVar7 = pbVar7 + 1;
          __s1 = __s1 + 1;
        } while (pbVar7 < pbVar6);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char*
xmemmem(const char *hay, const size_t hz_, const char *ndl, const size_t nz)
{
	const char *const eoh = hay + hz_;
	const char *const eon = ndl + nz;
	const char *hp;
	const char *np;
	const char *cand;
	unsigned int hsum;
	unsigned int nsum;
	unsigned int eqp;

	/* trivial checks first
         * a 0-sized needle is defined to be found anywhere in haystack
         * then run strchr() to find a candidate in HAYSTACK (i.e. a portion
         * that happens to begin with *NEEDLE) */
	if (nz == 0UL) {
		return deconst(hay);
	} else if ((hay = memchr(hay, *ndl, hz_)) == NULL) {
		/* trivial */
		return NULL;
	}

	/* First characters of haystack and needle are the same now. Both are
	 * guaranteed to be at least one character long.  Now computes the sum
	 * of characters values of needle together with the sum of the first
	 * needle_len characters of haystack. */
	for (hp = hay + 1U, np = ndl + 1U, hsum = *hay, nsum = *hay, eqp = 1U;
	     hp < eoh && np < eon;
	     hsum ^= *hp, nsum ^= *np, eqp &= *hp == *np, hp++, np++);

	/* HP now references the (NZ + 1)-th character. */
	if (np < eon) {
		/* haystack is smaller than needle, :O */
		return NULL;
	} else if (eqp) {
		/* found a match */
		return deconst(hay);
	}

	/* now loop through the rest of haystack,
	 * updating the sum iteratively */
	for (cand = hay; hp < eoh; hp++) {
		hsum ^= *cand++;
		hsum ^= *hp;

		/* Since the sum of the characters is already known to be
		 * equal at that point, it is enough to check just NZ - 1
		 * characters for equality,
		 * also CAND is by design < HP, so no need for range checks */
		if (hsum == nsum && memcmp(cand, ndl, nz - 1U) == 0) {
			return deconst(cand);
		}
	}
	return NULL;
}